

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtouch.c
# Opt level: O1

void touch_input_handle_begin
               (int id,double timestamp,float x,float y,_Bool primary,ALLEGRO_DISPLAY *disp)

{
  ALLEGRO_TOUCH_INPUT_STATE *pAVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  
  pAVar1 = &touch_input_state;
  uVar3 = 0;
  do {
    if (((ALLEGRO_TOUCH_STATE *)&pAVar1->touches[0].id)->id < 0) goto LAB_00192bff;
    uVar3 = uVar3 + 1;
    pAVar1 = (ALLEGRO_TOUCH_INPUT_STATE *)((long)pAVar1 + 0x20);
  } while (uVar3 != 0x10);
  uVar3 = 0xffffffff;
LAB_00192bff:
  if (-1 < (int)uVar3) {
    uVar2 = uVar3 & 0xffffffff;
    _al_event_source_lock(&touch_input.es);
    touch_input_state.touches[uVar2].id = (int)uVar3;
    touch_input_state.touches[uVar2].x = x;
    touch_input_state.touches[uVar2].y = y;
    touch_input_state.touches[uVar2].dx = 0.0;
    touch_input_state.touches[uVar2].dy = 0.0;
    *(_Bool *)(uVar2 * 0x20 + 0x1e4c94) = primary;
    touch_input_state.touches[uVar2].display = disp;
    _al_event_source_unlock(&touch_input.es);
    generate_touch_input_event
              (0x32,timestamp,touch_input_state.touches[uVar2].id,touch_input_state.touches[uVar2].x
               ,touch_input_state.touches[uVar2].y,touch_input_state.touches[uVar2].dx,
               touch_input_state.touches[uVar2].dy,*(_Bool *)(uVar2 * 0x20 + 0x1e4c94),disp);
    touch_ids[uVar2] = id;
  }
  return;
}

Assistant:

static void touch_input_handle_begin(int id, double timestamp, float x, float y, bool primary, ALLEGRO_DISPLAY *disp)
{
   int index= find_free_touch_state_index();
   if (index < 0)
       return;

   ALLEGRO_TOUCH_STATE* state = touch_input_state.touches + index;
   (void)primary;

   if (NULL == state)
      return;

   _al_event_source_lock(&touch_input.es);
   state->id      = index;
   state->x       = x;
   state->y       = y;
   state->dx      = 0.0f;
   state->dy      = 0.0f;
   state->primary = primary;
   state->display = disp;
   _al_event_source_unlock(&touch_input.es);

   generate_touch_input_event(ALLEGRO_EVENT_TOUCH_BEGIN, timestamp,
      state->id, state->x, state->y, state->dx, state->dy, state->primary,
      disp);

   touch_ids[index]= id;
}